

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_close(sqlite3_blob *pBlob)

{
  sqlite3_stmt *pStmt;
  sqlite3 *db;
  int iVar1;
  Incrblob *p;
  
  if (pBlob != (sqlite3_blob *)0x0) {
    pStmt = *(sqlite3_stmt **)(pBlob + 0x18);
    db = *(sqlite3 **)(pBlob + 0x20);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    sqlite3DbFreeNN(db,pBlob);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    iVar1 = sqlite3_finalize(pStmt);
    return iVar1;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_blob_close(sqlite3_blob *pBlob){
  Incrblob *p = (Incrblob *)pBlob;
  int rc;
  sqlite3 *db;

  if( p ){
    sqlite3_stmt *pStmt = p->pStmt;
    db = p->db;
    sqlite3_mutex_enter(db->mutex);
    sqlite3DbFree(db, p);
    sqlite3_mutex_leave(db->mutex);
    rc = sqlite3_finalize(pStmt);
  }else{
    rc = SQLITE_OK;
  }
  return rc;
}